

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

void cf_chacha20_core(uint8_t *key0,uint8_t *key1,uint8_t *nonce,uint8_t *constant,uint8_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint uVar19;
  uint32_t uVar20;
  uint uVar21;
  uint32_t uVar22;
  uint uVar23;
  uint32_t uVar24;
  uint uVar25;
  uint32_t uVar26;
  uint uVar27;
  uint32_t uVar28;
  uint uVar29;
  uint32_t uVar30;
  uint uVar31;
  uint32_t uVar32;
  uint uVar33;
  int local_b4;
  int i;
  uint32_t xf;
  uint32_t xe;
  uint32_t xd;
  uint32_t xc;
  uint32_t xb;
  uint32_t xa;
  uint32_t x9;
  uint32_t x8;
  uint32_t x7;
  uint32_t x6;
  uint32_t x5;
  uint32_t x4;
  uint32_t x3;
  uint32_t x2;
  uint32_t x1;
  uint32_t x0;
  uint32_t zf;
  uint32_t ze;
  uint32_t zd;
  uint32_t zc;
  uint32_t zb;
  uint32_t za;
  uint32_t z9;
  uint32_t z8;
  uint32_t z7;
  uint32_t z6;
  uint32_t z5;
  uint32_t z4;
  uint32_t z3;
  uint32_t z2;
  uint32_t z1;
  uint32_t z0;
  uint8_t *out_local;
  uint8_t *constant_local;
  uint8_t *nonce_local;
  uint8_t *key1_local;
  uint8_t *key0_local;
  
  uVar1 = read32_le(constant);
  uVar2 = read32_le(constant + 4);
  uVar3 = read32_le(constant + 8);
  uVar4 = read32_le(constant + 0xc);
  uVar5 = read32_le(key0);
  uVar6 = read32_le(key0 + 4);
  uVar7 = read32_le(key0 + 8);
  uVar8 = read32_le(key0 + 0xc);
  uVar9 = read32_le(key1);
  uVar10 = read32_le(key1 + 4);
  uVar11 = read32_le(key1 + 8);
  uVar12 = read32_le(key1 + 0xc);
  uVar13 = read32_le(nonce);
  uVar14 = read32_le(nonce + 4);
  uVar15 = read32_le(nonce + 8);
  uVar16 = read32_le(nonce + 0xc);
  x1 = uVar16;
  x0 = uVar15;
  zf = uVar14;
  ze = uVar13;
  zd = uVar12;
  zc = uVar11;
  zb = uVar10;
  za = uVar9;
  z9 = uVar8;
  z8 = uVar7;
  z7 = uVar6;
  z6 = uVar5;
  z5 = uVar4;
  z4 = uVar3;
  z3 = uVar2;
  z2 = uVar1;
  for (local_b4 = 0; local_b4 < 10; local_b4 = local_b4 + 1) {
    uVar17 = rotl32(ze ^ z6 + z2,0x10);
    uVar18 = rotl32(z6 ^ uVar17 + za,0xc);
    uVar19 = uVar18 + z6 + z2;
    uVar20 = rotl32(uVar17 ^ uVar19,8);
    uVar21 = uVar20 + uVar17 + za;
    uVar17 = rotl32(uVar18 ^ uVar21,7);
    uVar18 = rotl32(zf ^ z7 + z3,0x10);
    uVar22 = rotl32(z7 ^ uVar18 + zb,0xc);
    uVar23 = uVar22 + z7 + z3;
    uVar24 = rotl32(uVar18 ^ uVar23,8);
    uVar25 = uVar24 + uVar18 + zb;
    uVar18 = rotl32(uVar22 ^ uVar25,7);
    uVar22 = rotl32(x0 ^ z8 + z4,0x10);
    uVar26 = rotl32(z8 ^ uVar22 + zc,0xc);
    uVar27 = uVar26 + z8 + z4;
    uVar28 = rotl32(uVar22 ^ uVar27,8);
    uVar29 = uVar28 + uVar22 + zc;
    uVar22 = rotl32(uVar26 ^ uVar29,7);
    uVar26 = rotl32(x1 ^ z9 + z5,0x10);
    uVar30 = rotl32(z9 ^ uVar26 + zd,0xc);
    uVar31 = uVar30 + z9 + z5;
    uVar32 = rotl32(uVar26 ^ uVar31,8);
    uVar33 = uVar32 + uVar26 + zd;
    uVar26 = rotl32(uVar30 ^ uVar33,7);
    uVar19 = uVar18 + uVar19;
    uVar30 = rotl32(uVar32 ^ uVar19,0x10);
    uVar29 = uVar30 + uVar29;
    uVar18 = rotl32(uVar18 ^ uVar29,0xc);
    z2 = uVar18 + uVar19;
    x1 = rotl32(uVar30 ^ z2,8);
    zc = x1 + uVar29;
    z7 = rotl32(uVar18 ^ zc,7);
    uVar23 = uVar22 + uVar23;
    uVar18 = rotl32(uVar20 ^ uVar23,0x10);
    uVar33 = uVar18 + uVar33;
    uVar20 = rotl32(uVar22 ^ uVar33,0xc);
    z3 = uVar20 + uVar23;
    ze = rotl32(uVar18 ^ z3,8);
    zd = ze + uVar33;
    z8 = rotl32(uVar20 ^ zd,7);
    uVar27 = uVar26 + uVar27;
    uVar18 = rotl32(uVar24 ^ uVar27,0x10);
    uVar21 = uVar18 + uVar21;
    uVar20 = rotl32(uVar26 ^ uVar21,0xc);
    z4 = uVar20 + uVar27;
    zf = rotl32(uVar18 ^ z4,8);
    za = zf + uVar21;
    z9 = rotl32(uVar20 ^ za,7);
    uVar31 = uVar17 + uVar31;
    uVar18 = rotl32(uVar28 ^ uVar31,0x10);
    uVar25 = uVar18 + uVar25;
    uVar17 = rotl32(uVar17 ^ uVar25,0xc);
    z5 = uVar17 + uVar31;
    x0 = rotl32(uVar18 ^ z5,8);
    zb = x0 + uVar25;
    z6 = rotl32(uVar17 ^ zb,7);
  }
  write32_le(z2 + uVar1,out);
  write32_le(z3 + uVar2,out + 4);
  write32_le(z4 + uVar3,out + 8);
  write32_le(z5 + uVar4,out + 0xc);
  write32_le(z6 + uVar5,out + 0x10);
  write32_le(z7 + uVar6,out + 0x14);
  write32_le(z8 + uVar7,out + 0x18);
  write32_le(z9 + uVar8,out + 0x1c);
  write32_le(za + uVar9,out + 0x20);
  write32_le(zb + uVar10,out + 0x24);
  write32_le(zc + uVar11,out + 0x28);
  write32_le(zd + uVar12,out + 0x2c);
  write32_le(ze + uVar13,out + 0x30);
  write32_le(zf + uVar14,out + 0x34);
  write32_le(x0 + uVar15,out + 0x38);
  write32_le(x1 + uVar16,out + 0x3c);
  return;
}

Assistant:

void cf_chacha20_core(const uint8_t key0[16],
                      const uint8_t key1[16],
                      const uint8_t nonce[16],
                      const uint8_t constant[16],
                      uint8_t out[64])
{
  uint32_t z0, z1, z2, z3, z4, z5, z6, z7,
           z8, z9, za, zb, zc, zd, ze, zf;

  uint32_t x0 = z0 = read32_le(constant + 0),
           x1 = z1 = read32_le(constant + 4),
           x2 = z2 = read32_le(constant + 8),
           x3 = z3 = read32_le(constant + 12),
           x4 = z4 = read32_le(key0 + 0),
           x5 = z5 = read32_le(key0 + 4),
           x6 = z6 = read32_le(key0 + 8),
           x7 = z7 = read32_le(key0 + 12),
           x8 = z8 = read32_le(key1 + 0),
           x9 = z9 = read32_le(key1 + 4),
           xa = za = read32_le(key1 + 8),
           xb = zb = read32_le(key1 + 12),
           xc = zc = read32_le(nonce + 0),
           xd = zd = read32_le(nonce + 4),
           xe = ze = read32_le(nonce + 8),
           xf = zf = read32_le(nonce + 12);

#define QUARTER(a, b, c, d) \
  a += b; d = rotl32(d ^ a, 16); \
  c += d; b = rotl32(b ^ c, 12); \
  a += b; d = rotl32(d ^ a, 8);  \
  c += d; b = rotl32(b ^ c, 7);

  int i;
  for (i = 0; i < 10; i++)
  {
    QUARTER(z0, z4, z8, zc);
    QUARTER(z1, z5, z9, zd);
    QUARTER(z2, z6, za, ze);
    QUARTER(z3, z7, zb, zf);
    QUARTER(z0, z5, za, zf);
    QUARTER(z1, z6, zb, zc);
    QUARTER(z2, z7, z8, zd);
    QUARTER(z3, z4, z9, ze);
  }

  x0 += z0;
  x1 += z1;
  x2 += z2;
  x3 += z3;
  x4 += z4;
  x5 += z5;
  x6 += z6;
  x7 += z7;
  x8 += z8;
  x9 += z9;
  xa += za;
  xb += zb;
  xc += zc;
  xd += zd;
  xe += ze;
  xf += zf;

  write32_le(x0, out + 0);
  write32_le(x1, out + 4);
  write32_le(x2, out + 8);
  write32_le(x3, out + 12);
  write32_le(x4, out + 16);
  write32_le(x5, out + 20);
  write32_le(x6, out + 24);
  write32_le(x7, out + 28);
  write32_le(x8, out + 32);
  write32_le(x9, out + 36);
  write32_le(xa, out + 40);
  write32_le(xb, out + 44);
  write32_le(xc, out + 48);
  write32_le(xd, out + 52);
  write32_le(xe, out + 56);
  write32_le(xf, out + 60);
}